

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O0

REF_STATUS ref_shard_mark_cell_edge_split(REF_SHARD ref_shard,REF_INT cell,REF_INT cell_edge)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nodes [27];
  REF_CELL ref_cell;
  REF_INT cell_edge_local;
  REF_INT cell_local;
  REF_SHARD ref_shard_local;
  
  unique0x00012000 = ref_shard->grid->cell[0xb];
  uVar1 = ref_cell_nodes(unique0x00012000,cell,&ref_private_macro_code_rss_1);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0xac,
           "ref_shard_mark_cell_edge_split",(ulong)uVar1,"cell nodes");
    return uVar1;
  }
  switch(cell_edge) {
  case 0:
  case 0xb:
    uVar1 = ref_shard_mark_to_split(ref_shard,ref_private_macro_code_rss,nodes[4]);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0xb1,
             "ref_shard_mark_cell_edge_split",(ulong)uVar1,"mark1");
      return uVar1;
    }
    uVar1 = ref_shard_mark_to_split(ref_shard,ref_private_macro_code_rss_1,nodes[5]);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0xb2,
             "ref_shard_mark_cell_edge_split",(ulong)uVar1,"mark2");
      return uVar1;
    }
    break;
  default:
    printf("%s: %d: %s: cell edge %d not implemented, skipping.\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",199,
           "ref_shard_mark_cell_edge_split",(ulong)(uint)cell_edge);
    break;
  case 5:
  case 8:
    uVar1 = ref_shard_mark_to_split(ref_shard,nodes[0],nodes[3]);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0xb6,
             "ref_shard_mark_cell_edge_split",(ulong)uVar1,"mark1");
      return uVar1;
    }
    uVar1 = ref_shard_mark_to_split(ref_shard,nodes[1],nodes[2]);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0xb7,
             "ref_shard_mark_cell_edge_split",(ulong)uVar1,"mark2");
      return uVar1;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_shard_mark_cell_edge_split(REF_SHARD ref_shard,
                                                  REF_INT cell,
                                                  REF_INT cell_edge) {
  REF_CELL ref_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  ref_cell = ref_grid_hex(ref_shard_grid(ref_shard));

  RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");

  switch (cell_edge) {
    case 0:
    case 11:
      RSS(ref_shard_mark_to_split(ref_shard, nodes[1], nodes[6]), "mark1");
      RSS(ref_shard_mark_to_split(ref_shard, nodes[0], nodes[7]), "mark2");
      break;
    case 5:
    case 8:
      RSS(ref_shard_mark_to_split(ref_shard, nodes[2], nodes[5]), "mark1");
      RSS(ref_shard_mark_to_split(ref_shard, nodes[3], nodes[4]), "mark2");
      break;

      /*
    case 2:  case 6:
      RSS( ref_shard_mark_to_split(ref_shard, nodes[4], nodes[6] ), "mark1" );
      RSS( ref_shard_mark_to_split(ref_shard, nodes[0], nodes[2] ), "mark2" );
      break;
    case 4:  case 7:
      RSS( ref_shard_mark_to_split(ref_shard, nodes[7], nodes[5] ), "mark1" );
      RSS( ref_shard_mark_to_split(ref_shard, nodes[3], nodes[1] ), "mark2" );
      break;
      */

    default:
      printf("%s: %d: %s: cell edge %d not implemented, skipping.\n", __FILE__,
             __LINE__, __func__, cell_edge);
      /*
      RSB( REF_IMPLEMENT, "can not handle cell edge",
           printf("cell edge %d\n",cell_edge););
      */
      break;
  }

  return REF_SUCCESS;
}